

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall FIX::SocketInitiator::onStart(SocketInitiator *this)

{
  SocketConnector *this_00;
  bool bVar1;
  time_t tVar2;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  time_t start;
  time_t now;
  time_t local_30 [2];
  
  Initiator::connect(&this->super_Initiator,in_ESI,in_RDX,in_ECX);
  this_00 = &this->m_connector;
  while (((this->super_Initiator).m_stop._M_base._M_i & 1U) == 0) {
    SocketConnector::block(this_00,&this->super_Strategy,false,1.0);
    (*(this->super_Initiator)._vptr_Initiator[0xd])(this,this_00);
  }
  local_30[0] = 0;
  local_30[1] = 0;
  time(local_30);
  do {
    bVar1 = Initiator::isLoggedOn(&this->super_Initiator);
    if (!bVar1) {
      return;
    }
    SocketConnector::block(this_00,&this->super_Strategy,false,0.0);
    tVar2 = time(local_30 + 1);
  } while (tVar2 + -5 < local_30[0]);
  return;
}

Assistant:

void SocketInitiator::onStart() {
  connect();

  while (!isStopped()) {
    m_connector.block(*this, false, 1.0);
    onTimeout(m_connector);
  }

  time_t start = 0;
  time_t now = 0;

  ::time(&start);
  while (isLoggedOn()) {
    m_connector.block(*this);
    if (::time(&now) - 5 >= start) {
      break;
    }
  }
}